

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::_::
CopyConstructArray_<capnp::compiler::CompilerMain::OutputDirective,_capnp::compiler::CompilerMain::OutputDirective_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  String *pSVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  OutputDirective *pOVar4;
  OutputDirective *pOVar5;
  OutputDirective *pOVar6;
  
  pOVar4 = this->start;
  pOVar6 = this->pos;
  if (pOVar4 < pOVar6) {
    do {
      pOVar5 = pOVar6 + -1;
      this->pos = pOVar5;
      if ((pOVar6[-1].dir.ptr.isSet == true) &&
         (pSVar1 = pOVar6[-1].dir.ptr.field_1.value.parts.ptr, pSVar1 != (String *)0x0)) {
        sVar2 = pOVar6[-1].dir.ptr.field_1.value.parts.size_;
        pOVar6[-1].dir.ptr.field_1.value.parts.ptr = (String *)0x0;
        pOVar6[-1].dir.ptr.field_1.value.parts.size_ = 0;
        pAVar3 = pOVar6[-1].dir.ptr.field_1.value.parts.disposer;
        (**pAVar3->_vptr_ArrayDisposer)
                  (pAVar3,pSVar1,0x18,sVar2,sVar2,ArrayDisposer::Dispose_<kj::String>::destruct);
        pOVar4 = this->start;
        pOVar5 = this->pos;
      }
      pOVar6 = pOVar5;
    } while (pOVar4 < pOVar5);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }